

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::LoopDependenceAnalysis::ZIVTest
          (LoopDependenceAnalysis *this,
          pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *subscript_pair)

{
  SENode *pSVar1;
  SENode *pSVar2;
  long *plVar3;
  char *pcVar4;
  char *pcVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  string *debug_msg;
  string local_88;
  string local_68;
  string local_48;
  
  pSVar1 = subscript_pair->first;
  pSVar2 = subscript_pair->second;
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"Performing ZIVTest","");
  PrintDebug(this,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if (pSVar1 == pSVar2) {
    paVar6 = &local_48.field_2;
    pcVar5 = "ZIVTest found EQ dependence.";
    pcVar4 = "";
    debug_msg = &local_48;
    local_48._M_dataplus._M_p = (pointer)paVar6;
  }
  else {
    paVar6 = &local_68.field_2;
    pcVar5 = "ZIVTest found independence.";
    pcVar4 = "";
    debug_msg = &local_68;
    local_68._M_dataplus._M_p = (pointer)paVar6;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)debug_msg,pcVar5,pcVar4);
  PrintDebug(this,debug_msg);
  plVar3 = (long *)(debug_msg->_M_dataplus)._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)plVar3 != paVar6) {
    operator_delete(plVar3,paVar6->_M_allocated_capacity + 1);
  }
  return pSVar1 != pSVar2;
}

Assistant:

bool LoopDependenceAnalysis::ZIVTest(
    const std::pair<SENode*, SENode*>& subscript_pair) {
  auto source = std::get<0>(subscript_pair);
  auto destination = std::get<1>(subscript_pair);

  PrintDebug("Performing ZIVTest");
  // If source == destination, dependence with direction = and distance 0.
  if (source == destination) {
    PrintDebug("ZIVTest found EQ dependence.");
    return false;
  } else {
    PrintDebug("ZIVTest found independence.");
    // Otherwise we prove independence.
    return true;
  }
}